

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedCrandMont(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  word wVar4;
  long in_RCX;
  ulong in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t i;
  dword prod;
  word w;
  word borrow;
  word carry;
  ulong local_60;
  ulong local_40;
  word local_38;
  ulong local_30;
  
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  for (local_60 = 0; local_60 < in_RDX; local_60 = local_60 + 1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI[local_60] * in_RCX;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = -*in_RSI;
    uVar3 = in_RDI[local_60] * in_RCX + local_30;
    in_RDI[local_60 + in_RDX] = in_RDI[local_60 + in_RDX] + uVar3;
    local_30 = (ulong)(uVar3 < local_30 || in_RDI[local_60 + in_RDX] < uVar3);
    local_40 = local_38 + SUB168(auVar1 * auVar2,8);
    local_38 = (word)(int)(uint)(in_RDI[local_60 + 1] < local_40 || local_40 < local_38);
    in_RDI[local_60 + 1] = in_RDI[local_60 + 1] - local_40;
  }
  wVar4 = zzSubW2(in_RDI + in_RDX + 1,in_RDX - 1,local_38);
  for (local_60 = 0; local_60 < in_RDX; local_60 = local_60 + 1) {
    in_RDI[local_60] = in_RDI[in_RDX + local_60];
    local_40 = (long)(int)(uint)(in_RSI[local_60] < in_RDI[local_60]) |
               (long)(int)(uint)(in_RSI[local_60] == in_RDI[local_60]) & local_40;
  }
  zzSubAndW(in_RDI,in_RSI,in_RDX,-(local_40 | local_30 - wVar4));
  return;
}

Assistant:

void SAFE(zzRedCrandMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word borrow = 0;
	register word w = 0;
	register dword prod;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] % 2  && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		zzMul11(prod, w, WORD_0 - mod[0]);
		w += carry;
		carry = wordLess01(w, carry);
		a[i + n] += w;
		carry |= wordLess01(a[i + n], w); 
		w = (word)(prod >> B_PER_W);
		w += borrow;
		borrow = wordLess01(w, borrow);
		borrow |= wordLess01(a[i + 1], w);
		a[i + 1] -= w;
	}
	// a <- a - borrow * B^{n + 1}
	carry -= zzSubW2(a + n + 1, n - 1, borrow);
	// a <- a / B^n, a >= mod?
	for (i = 0; i < n; ++i)
	{
		a[i] = a[n + i];
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= carry, w = WORD_0 - w;
	zzSubAndW(a, mod, n, w);
	// очистка
	prod = 0;
	carry = borrow = w = 0;
}